

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeMassMatrix(ChElementShellReissner4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChElementShellReissner4 *pCVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  double in_XMM0_Qa;
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> inertia_n;
  ChMatrix33<double> Rot_I;
  ChMatrix33<double> Rot;
  assign_op<double,_double> local_199;
  double local_198;
  ChElementShellReissner4 *local_190;
  plainobjectbase_evaluator_data<double,_3> local_188;
  DstXprType *local_180;
  ChMatrix33<double> *local_178;
  double local_170;
  ChMatrixNM<double,_24,_24> *local_168;
  ulong local_160;
  ulong local_158;
  ChMatrix33<double> local_150;
  ChMatrix33<double> local_108;
  undefined1 local_c0 [32];
  double dStack_a0;
  undefined1 auStack_98 [24];
  double local_80;
  DstXprType local_78;
  
  local_168 = &this->m_MassMatrix;
  uVar13 = 0;
  memset(local_168,0,0x1200);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x29])(this);
  local_170 = in_XMM0_Qa * this->tot_thickness;
  local_178 = this->T_i;
  lVar10 = 0x318;
  bVar5 = 4;
  local_190 = this;
  do {
    pCVar4 = local_190;
    uVar6 = (bVar5 & 7) + 1;
    if (2 < uVar6) {
      uVar6 = 3;
    }
    uVar7 = -((int)uVar13 * -0x10 + 0x18U >> 3) & 7;
    if (2 < uVar7) {
      uVar7 = 3;
    }
    local_158 = (ulong)(uVar7 * 8);
    uVar8 = uVar7;
    if (uVar7 < 3) {
      uVar8 = 2;
    }
    uVar11 = uVar13 & 0xffffffff ^ 2;
    local_198 = local_170 * local_190->alpha_i[uVar11];
    dVar1 = local_190->tot_thickness * local_190->tot_thickness;
    dVar2 = local_190->m_lenX * local_190->m_lenX;
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_188;
    local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)(local_178 + uVar11);
    dVar3 = local_190->m_lenY * local_190->m_lenY;
    auStack_98 = ZEXT824(0);
    local_c0._24_8_ = 0;
    local_c0._8_16_ = ZEXT816(0);
    local_c0._0_8_ = local_198 * (dVar3 + dVar1) * 0.08333333333333333 * 0.25;
    dStack_a0 = local_198 * (dVar1 + dVar2) * 0.08333333333333333 * 0.25;
    local_80 = local_198 * (dVar3 + dVar2) * 0.08333333333333333 * 0.25;
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&local_108;
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&local_199;
    local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&((local_190->m_nodes).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->field_0x58;
    local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         1.48219693752374e-323;
    local_188.data = (double *)&local_78;
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)&local_78;
    local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_150);
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)local_c0;
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_78;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&local_108,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_150);
    local_188.data = (double *)&local_108;
    local_180 = &local_78;
    ChMatrix33<double>::operator=
              (&local_150,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                *)&local_188);
    lVar9 = 0;
    (local_168->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array[uVar13 * 0x96] = local_198;
    (local_168->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array[uVar13 * 0x96 + 0x19] = local_198;
    uVar12 = -((uint)((int)local_168 + 0x18 + (int)uVar13 * 0x30) >> 3) & 7;
    (local_168->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array[uVar13 * 0x96 + 0x32] = local_198;
    local_198 = (double)lVar10;
    local_160 = uVar13;
    do {
      if (uVar12 == 0) {
LAB_00789cbd:
        memcpy((void *)((long)&(pCVar4->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase +
                       lVar10 + (ulong)(uVar6 << 3)),
               (void *)((long)local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + lVar9 + (ulong)(uVar6 << 3)),
               (ulong)((uVar8 - uVar7) * 8 + 8));
      }
      else {
        memcpy((void *)((long)&(local_190->super_ChElementShell).super_ChElementGeneric.
                               super_ChElementBase._vptr_ChElementBase + lVar10),
               (void *)((long)local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + lVar9),local_158);
        if (uVar12 < 3) goto LAB_00789cbd;
      }
      lVar10 = lVar10 + 0xc0;
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x48);
    uVar13 = local_160 + 1;
    lVar10 = (long)local_198 + 0x4b0;
    bVar5 = bVar5 + 2;
    if (uVar13 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void ChElementShellReissner4::ComputeMassMatrix() {
    m_MassMatrix.setZero();

    // loop over all layers, to compute total "mass per area" = sum(rho_i*thickness_i) = average_rho * sum(thickness_i)
    double avg_density = this->GetDensity();
    double mass_per_area = avg_density * tot_thickness;

    // Heuristic, simplified 'lumped' mass matrix.
    // Split the mass in 4 pieces, weighting as the jacobian at integration point, but
    // lump at the node closest to integration point.
    // This is simpler than the stiffness-consistent mass matrix that would require
    // integration over gauss points.

    for (int n = 0; n < NUMNODES; n++) {
        int igp = (n + 2) % 4;  // id of closest gauss point to node
        double jacobian =
            alpha_i[igp];  // weight: jacobian at gauss point (another,brute force,option would be 0.25 for all nodes)

        double nodemass = (jacobian * mass_per_area);

        // Approximate (!) inertia of a quarter of tile, note *(1/4) because only the quarter tile,
        // in local system of Gauss point
        double Ixx = (pow(this->GetLengthY(), 2) + pow(tot_thickness, 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        double Iyy = (pow(this->GetLengthX(), 2) + pow(tot_thickness, 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        double Izz = (pow(this->GetLengthX(), 2) + pow(this->GetLengthY(), 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        ChMatrix33<> box_inertia(ChVector<>(Ixx, Iyy, Izz));
        // ..and rotate inertia in local system of node: (local because ystem-level rotational coords of nodes are
        // ang.vel in loc sys)
        // I' = A'* T * I * T' * A
        //    = Rot * I * Rot'
        ChMatrix33<> Rot = m_nodes[n]->GetA().transpose() * T_i[igp];
        ChMatrix33<> Rot_I(Rot * box_inertia);
        ChMatrix33<> inertia_n;
        inertia_n = Rot_I * Rot.transpose();

        int node_off = n * 6;
        m_MassMatrix(node_off + 0, node_off + 0) = nodemass;
        m_MassMatrix(node_off + 1, node_off + 1) = nodemass;
        m_MassMatrix(node_off + 2, node_off + 2) = nodemass;
        m_MassMatrix.block(node_off + 3, node_off + 3, 3, 3) = inertia_n;

    }  // end loop on nodes
}